

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type fmt::v5::
     visit<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (precision_checker<fmt::v5::internal::error_handler> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               arg)

{
  undefined4 value;
  value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  custom;
  custom_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_38;
  basic_string_view<char> local_28;
  precision_checker<fmt::v5::internal::error_handler> *local_18;
  precision_checker<fmt::v5::internal::error_handler> *vis_local;
  
  custom.field_0 = arg.value_.field_0;
  value = arg.value_.field_0.int_value;
  local_18 = vis;
  switch(arg.type_) {
  case none_type:
  default:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()(vis);
    break;
  case named_arg_type:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/format.h"
                  ,0x4b7,
                  "typename internal::result_of<Visitor (int)>::type fmt::visit(Visitor &&, basic_format_arg<Context>) [Visitor = fmt::internal::precision_checker<fmt::internal::error_handler>, Context = fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>]"
                 );
  case int_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()(vis,value)
    ;
    break;
  case uint_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()(vis,value)
    ;
    break;
  case long_long_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,arg.value_.field_0.long_long_value);
    break;
  case ulong_long_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,arg.value_.field_0.ulong_long_value);
    break;
  case bool_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,value != 0);
    break;
  case char_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,arg.value_.field_0._0_1_);
    break;
  case double_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,arg.value_.field_0.double_value);
    break;
  case last_numeric_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,arg.value_.field_0.long_double_value);
    break;
  case cstring_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,arg.value_.field_0.string.value);
    break;
  case string_type:
    basic_string_view<char>::basic_string_view
              (&local_28,arg.value_.field_0.string.value,arg.value_.field_0.string.size);
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,local_28);
    break;
  case pointer_type:
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,arg.value_.field_0.pointer);
    break;
  case custom_type:
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::handle::handle((handle *)&local_38,
                     (custom_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                      )custom.field_0);
    vis_local = (precision_checker<fmt::v5::internal::error_handler> *)
                internal::precision_checker<fmt::v5::internal::error_handler>::operator()
                          (vis,(handle)local_38);
  }
  return (type)vis_local;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit(Visitor &&vis, basic_format_arg<Context> arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}